

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall lzham::lzcompressor::compress_block(lzcompressor *this,void *pBuf,uint buf_len)

{
  bool bVar1;
  uint buf_len_00;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    uVar2 = buf_len;
    if (uVar2 == 0) break;
    buf_len_00 = search_accelerator::get_max_add_bytes(&this->m_accel);
    if (uVar2 <= buf_len_00) {
      buf_len_00 = uVar2;
    }
    bVar1 = compress_block_internal(this,(void *)(uVar3 + (long)pBuf),buf_len_00);
    uVar3 = (ulong)((int)uVar3 + buf_len_00);
    buf_len = uVar2 - buf_len_00;
  } while (bVar1);
  return uVar2 == 0;
}

Assistant:

bool lzcompressor::compress_block(const void* pBuf, uint buf_len)
   {
      uint cur_ofs = 0;
      uint bytes_remaining = buf_len;
      while (bytes_remaining)
      {
         uint bytes_to_compress = math::minimum(m_accel.get_max_add_bytes(), bytes_remaining);
         if (!compress_block_internal(static_cast<const uint8*>(pBuf) + cur_ofs, bytes_to_compress))
         {
            LZHAM_LOG_ERROR(7046);
            return false;
         }

         cur_ofs += bytes_to_compress;
         bytes_remaining -= bytes_to_compress;
      }
      return true;
   }